

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void undobuffersize(int n)

{
  int n_local;
  
  if (undobufferlength < n) {
    if (undobuffer == (char *)0x0) {
      undobufferlength = n + 9;
      undobuffer = (char *)malloc((long)undobufferlength);
    }
    else {
      do {
        undobufferlength = undobufferlength << 1;
      } while (undobufferlength < n);
      undobuffer = (char *)realloc(undobuffer,(long)undobufferlength);
    }
  }
  return;
}

Assistant:

static void undobuffersize(int n)
{
  if (n > undobufferlength) {
    if (undobuffer) {
      do {
	undobufferlength *= 2;
      } while (undobufferlength < n);
      undobuffer = (char *) realloc(undobuffer, undobufferlength);
    } else {
      undobufferlength = n + 9;
      undobuffer = (char *) malloc(undobufferlength);
    }
  }
}